

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O2

void __thiscall MedianFilterCV_8U::filterImageEdges(MedianFilterCV_8U *this,Mat *image)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  uchar uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  MedianFilterCV_8U *this_00;
  int iVar11;
  int i;
  long lVar12;
  int j;
  long lVar13;
  long lVar14;
  long lVar15;
  int local_b8;
  uchar array [6];
  int ranges [4] [4];
  
  ranges[0][0] = 0;
  ranges[0][1] = 0;
  ranges[0][2] = 0;
  ranges[0][3] = *(int *)(image + 0xc) + -1;
  ranges[1][0] = 1;
  ranges[1][1] = *(int *)(image + 8) + -1;
  ranges[1][2] = 0;
  ranges[1][3] = 0;
  ranges[2][0] = ranges[1][1];
  ranges[2][1] = ranges[1][1];
  ranges[2][2] = 0;
  ranges[2][3] = ranges[0][3];
  ranges[3][0] = 1;
  ranges[3][1] = ranges[1][1];
  ranges[3][2] = ranges[0][3];
  ranges[3][3] = ranges[0][3];
  for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 0x10) {
    iVar1 = *(int *)((long)ranges[0] + lVar9);
    iVar2 = *(int *)((long)ranges[0] + lVar9 + 4);
    local_b8 = iVar1 + -1;
    lVar14 = (long)iVar1;
    while (lVar14 <= iVar2) {
      iVar1 = *(int *)((long)ranges[0] + lVar9 + 8);
      iVar3 = *(int *)((long)ranges[0] + lVar9 + 0xc);
      iVar8 = iVar1 + -1;
      lVar15 = (long)iVar1;
      while (lVar15 <= iVar3) {
        array[4] = '\0';
        array[5] = 0xff;
        iVar1 = *(int *)(image + 8);
        iVar4 = *(int *)(image + 0xc);
        lVar5 = *(long *)(image + 0x10);
        plVar6 = *(long **)(image + 0x48);
        iVar11 = 0;
        for (lVar12 = (long)local_b8; lVar13 = (long)iVar8, lVar12 <= lVar14 + 1;
            lVar12 = lVar12 + 1) {
          for (; lVar13 <= lVar15 + 1; lVar13 = lVar13 + 1) {
            if (((-1 < (int)((uint)lVar13 | (uint)lVar12)) && (lVar12 < iVar1)) && (lVar13 < iVar4))
            {
              lVar10 = (long)iVar11;
              iVar11 = iVar11 + 1;
              array[lVar10] = *(uchar *)(lVar13 + *plVar6 * lVar12 + lVar5);
            }
          }
        }
        sortThreeElements(this,array);
        this_00 = this;
        sortThreeElements(this,array + 3);
        uVar7 = getMedianOfTwoSortedArray(this_00,array,3,array + 3,3);
        uVar7 = getActualPixel(this,uVar7,(int)lVar14,(int)lVar15);
        *(uchar *)(lVar15 + **(long **)(this->resultImage + 0x48) * lVar14 +
                            *(long *)(this->resultImage + 0x10)) = uVar7;
        iVar8 = iVar8 + 1;
        lVar15 = lVar15 + 1;
      }
      local_b8 = local_b8 + 1;
      lVar14 = lVar14 + 1;
    }
  }
  return;
}

Assistant:

void MedianFilterCV_8U::filterImageEdges(const cv::Mat &image) {


    // Array of ranges to filter. Each range consists of two pairs.
    // The first and second is a range in y, third and fourth is a range in x.
    // For example {0, 0, 0, image.cols - 1} range specifying the first line
    int ranges[4][4] = {{0, 0, 0, image.cols - 1},
                        {1, image.rows - 1, 0, 0},
                        {image.rows - 1, image.rows - 1, 0, image.cols - 1},
                        {1, image.rows - 1, image.cols - 1, image.cols - 1}}; // 42 operations


    uchar tempMedian;                                                         // 1 operations
    // if first or last line (len = 1920)  (1 + 2 + 4 + 2 + 4 * 1920 + 1920 * (1 + 4 + 1 + 14 + 14 + ~80 + 63)) * 2 = 695052
    // if the first or last column (hei = 1080) (1 + 2 + 4 + 2 + 4 * 1078 + 1078 * (1 + 4 + 1 + 14 + 14 + ~80 + 63)) * 2 = 390254
    for (auto range : ranges) {                                               // 4 operations
        int position = 0;                                                     // 1 operation
        for (int y = range[0]; y <= range[1]; ++y) {                          // 2 operations + 4 at every step
            for (int x = range[2]; x <= range[3]; ++x) {                      // 2 operations + 4 at every step
                uchar array[6];                                               // 1 operation
                // Add 0 and 255 in case we are looking for a median in the corners.
                // Thus we process corner pixels as well as non-corner pixels
                array[4] = 0;                                                 // 2 operations
                array[5] = 255;                                               // 2 operations

                position = 0;                                                 // 1 operation
                for (int i = y - 1; i <= y + 1; ++i) {                        // 2 operations + 12
                    for (int j = x - 1; j <= x + 1; ++j) {                    // 2 operations + 12
                        if (i < 0 || j < 0 || i >= image.rows || j >= image.cols) { // 9 operations
                            continue;                                         // 1 operation
                        }

                        array[position++] = image.at<uchar>(i, j);            // 7 operations
                    }
                }

                // sort the first 3 and last 3 elements
                sortThreeElements(array);                                     // 1 operation + operations of sort
                sortThreeElements(array + 3);                                 // 2 operations + operations of sort

                tempMedian = getMedianOfTwoSortedArray(array, 3, array + 3, 3);// 3 operations
                resultImage->at<uchar>(y, x) = getActualPixel(tempMedian, y, x);// 3 operations
            }
        }
    }
}